

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void __thiscall
Qentem::QTest::IsEqual<Qentem::StringStream<char>,char[3]>
          (QTest *this,StringStream<char> *left,char (*right) [3],unsigned_long line)

{
  bool bVar1;
  unsigned_long line_local;
  char (*right_local) [3];
  StringStream<char> *left_local;
  QTest *this_local;
  
  if ((((this->error_ & 1U) == 0) || ((this->continue_on_error_ & 1U) != 0)) &&
     (bVar1 = StringStream<char>::operator!=(left,*right), bVar1)) {
    this->error_ = true;
    PrintErrorMessage<Qentem::StringStream<char>,char[3]>(this,false,left,right,line);
  }
  return;
}

Assistant:

QENTEM_NOINLINE void IsEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left != right)) {
            error_ = true;
            QTest::PrintErrorMessage(false, left, right, line);
        }
    }